

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O1

string * __thiscall
vkt::pipeline::(anonymous_namespace)::CacheTestParam::generateTestName_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  bool bVar1;
  ulong uVar2;
  long *plVar3;
  long *in_RCX;
  ulong uVar4;
  long *local_70;
  long local_60;
  long lStack_58;
  string local_50;
  
  getShaderFlagStr_abi_cxx11_
            (__return_storage_ptr__,(_anonymous_namespace_ *)(ulong)*(uint *)((long)this + 8),0,
             SUB81(in_RCX,0));
  if (1 < *(ulong *)((long)this + 0x20)) {
    uVar2 = 1;
    uVar4 = 2;
    do {
      getShaderFlagStr_abi_cxx11_
                (&local_50,(_anonymous_namespace_ *)(ulong)*(uint *)((long)this + uVar2 * 4 + 8),0,
                 SUB81(in_RCX,0));
      plVar3 = (long *)std::__cxx11::string::insert((ulong)&local_50,0,'\x01');
      in_RCX = plVar3 + 2;
      if ((long *)*plVar3 == in_RCX) {
        local_60 = *in_RCX;
        lStack_58 = plVar3[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *in_RCX;
        local_70 = (long *)*plVar3;
      }
      *plVar3 = (long)in_RCX;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bVar1 = uVar4 < *(ulong *)((long)this + 0x20);
      uVar2 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string CacheTestParam::generateTestName (void) const
{
	std::string result(getShaderFlagStr(m_shaders[0], false));

	for(deUint32 ndx = 1; ndx < m_shaderCount; ndx++)
		result += '_' + getShaderFlagStr(m_shaders[ndx], false) ;

	return result;
}